

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O0

string * __thiscall
CLI::detail::
generate_map<std::vector<std::pair<std::__cxx11::string,(anonymous_namespace)::C_A_T_C_H_T_E_S_T_24::test()::test_cli>,std::allocator<std::pair<std::__cxx11::string,(anonymous_namespace)::C_A_T_C_H_T_E_S_T_24::test()::test_cli>>>>
          (string *__return_storage_ptr__,detail *this,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_test_cli>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_test_cli>_>_>
          *map,bool key_only)

{
  detail *this_00;
  string *in_R8;
  allocator local_79;
  string local_78 [39];
  byte local_51;
  string local_50;
  allocator local_1b;
  undefined1 local_1a;
  byte local_19;
  detail *pdStack_18;
  bool key_only_local;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_test_cli>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_test_cli>_>_>
  *map_local;
  string *out;
  
  local_19 = (byte)map & 1;
  local_1a = 0;
  pdStack_18 = this;
  map_local = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_test_cli>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_test_cli>_>_>
               *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,1,'{',&local_1b);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b);
  this_00 = (detail *)
            smart_deref<const_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_test_cli>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_test_cli>_>_>,_(CLI::detail::enabler)0>
                      ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_test_cli>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_test_cli>_>_>
                        *)pdStack_18);
  local_51 = local_19 & 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,",",&local_79);
  join<std::vector<std::pair<std::__cxx11::string,(anonymous_namespace)::C_A_T_C_H_T_E_S_T_24::test()::test_cli>,std::allocator<std::pair<std::__cxx11::string,(anonymous_namespace)::C_A_T_C_H_T_E_S_T_24::test()::test_cli>>>,CLI::detail::generate_map<std::vector<std::pair<std::__cxx11::string,(anonymous_namespace)::C_A_T_C_H_T_E_S_T_24::test()::test_cli>,std::allocator<std::pair<std::__cxx11::string,(anonymous_namespace)::C_A_T_C_H_T_E_S_T_24::test()::test_cli>>>>(std::vector<std::pair<std::__cxx11::string,(anonymous_namespace)::C_A_T_C_H_T_E_S_T_24::test()::test_cli>,std::allocator<std::pair<std::__cxx11::string,(anonymous_namespace)::C_A_T_C_H_T_E_S_T_24::test()::test_cli>>>const&,bool)::_lambda(std::pair<std::__cxx11::string,(anonymous_namespace)::C_A_T_C_H_T_E_S_T_24::test()::test_cli>const&)_1_,void>
            (&local_50,this_00,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_test_cli>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_test_cli>_>_>
              *)(ulong)local_51,(anon_class_1_1_05c8830a)SUB81(local_78,0),in_R8);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string generate_map(const T &map, bool key_only = false) {
    using element_t = typename detail::element_type<T>::type;
    using iteration_type_t = typename detail::pair_adaptor<element_t>::value_type;  // the type of the object pair
    std::string out(1, '{');
    out.append(detail::join(
        detail::smart_deref(map),
        [key_only](const iteration_type_t &v) {
            std::string res{detail::to_string(detail::pair_adaptor<element_t>::first(v))};

            if(!key_only) {
                res.append("->");
                res += detail::to_string(detail::pair_adaptor<element_t>::second(v));
            }
            return res;
        },
        ","));
    out.push_back('}');
    return out;
}